

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::EndRead3dmObjectTable(ON_BinaryArchive *this)

{
  ON__3dmV1LayerIndex *pOVar1;
  bool bVar2;
  ON__3dmV1LayerIndex *p;
  ON__3dmV1LayerIndex *pOStack_20;
  int i;
  ON__3dmV1LayerIndex *next;
  bool rc;
  ON_BinaryArchive *this_local;
  
  bVar2 = EndRead3dmTable(this,0x10000013);
  if (this->m_V1_layer_list != (ON__3dmV1LayerIndex *)0x0) {
    pOStack_20 = this->m_V1_layer_list;
    this->m_V1_layer_list = (ON__3dmV1LayerIndex *)0x0;
    for (p._4_4_ = 0; pOStack_20 != (ON__3dmV1LayerIndex *)0x0 && p._4_4_ < 1000;
        p._4_4_ = p._4_4_ + 1) {
      pOVar1 = pOStack_20->m_next;
      onfree(pOStack_20);
      pOStack_20 = pOVar1;
    }
  }
  return bVar2;
}

Assistant:

bool ON_BinaryArchive::EndRead3dmObjectTable()
{
  bool rc = EndRead3dmTable( TCODE_OBJECT_TABLE );

  if ( 0 != m_V1_layer_list )
  {
    struct ON__3dmV1LayerIndex* next = m_V1_layer_list;
    m_V1_layer_list = 0;
    for ( int i = 0; 0 != next && i < 1000; i++ )
    {
      struct ON__3dmV1LayerIndex* p = next;
      next = p->m_next;
      onfree(p);
    }
  }

  return rc;
}